

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O2

void nsh_run(nsh_t *nsh)

{
  nsh_history_t *hist;
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  nsh_status_t nVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  char **ppcVar8;
  nsh_cmd_t *pnVar9;
  uint uVar10;
  char (*pacVar11) [16];
  uint uVar12;
  char *pcVar13;
  long lVar14;
  uint i;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  char *argv [32];
  nsh_cmd_array_t local_540;
  char args [32] [16];
  long lVar15;
  
  memset(argv,0,0x100);
  hist = &nsh->history;
LAB_00101380:
  nsh_io_print_prompt();
  nsh->current_history_entry = 0xffffffff;
  nsh_line_buffer_reset(&nsh->line);
LAB_001013a5:
  do {
    cVar1 = nsh_io_get_char();
    switch(cVar1) {
    case '\b':
      _Var2 = nsh_line_buffer_is_empty(&nsh->line);
      if (!_Var2) {
        nsh_io_erase_last_char();
        nsh_line_buffer_erase_last_char(&nsh->line);
      }
      goto LAB_001013a5;
    case '\t':
      nsh_cmd_array_init(&local_540);
      uVar16 = 0;
      pnVar9 = (nsh->cmds).array;
      for (; uVar16 < (nsh->cmds).count; uVar16 = uVar16 + 1) {
        iVar5 = bcmp(nsh,pnVar9->name,(ulong)(nsh->line).size);
        if (iVar5 == 0) {
          uVar7 = (ulong)local_540.count;
          local_540.count = local_540.count + 1;
          nsh_cmd_copy(local_540.array + uVar7,pnVar9);
        }
        pnVar9 = pnVar9 + 1;
      }
      if (local_540.count != 0) {
        nsh_cmd_array_lexicographic_sort(&local_540);
        nsh_io_put_newline();
        pcVar13 = local_540.array[0].name;
        for (uVar16 = 0; uVar16 < local_540.count; uVar16 = uVar16 + 1) {
          nsh_io_put_string(pcVar13);
          nsh_io_put_char(' ');
          pcVar13 = pcVar13 + 0x18;
        }
      }
      nsh_io_put_newline();
      nsh_io_print_prompt();
      nsh_io_put_buffer((char *)nsh,(nsh->line).size);
      goto LAB_001013a5;
    case '\n':
    case '\r':
      nsh_line_buffer_append_null(&nsh->line);
      _Var2 = nsh_line_buffer_is_empty(&nsh->line);
      if (!_Var2) {
        nsh_history_add_entry(hist,(char *)nsh);
      }
      nsh_io_put_newline();
      sVar6 = strlen((char *)nsh);
      uVar16 = 0;
      lVar17 = 1;
      lVar15 = 0;
      uVar12 = 0;
      goto LAB_001015b0;
    case '\v':
    case '\f':
      goto switchD_001013bc_caseD_b;
    }
    if (cVar1 == '\x1b') {
      nsh_io_get_char();
      cVar1 = nsh_io_get_char();
      if (cVar1 == 'B') {
        uVar3 = nsh->current_history_entry;
        uVar12 = uVar3;
        if (uVar3 < 0x10) {
LAB_00101447:
          nsh->current_history_entry = uVar3 - 1;
          uVar12 = uVar3 - 1;
        }
        if (uVar12 == 0xffffffff) {
          nsh_io_erase_line();
          nsh_io_print_prompt();
          nsh_line_buffer_reset(&nsh->line);
          goto LAB_001013a5;
        }
      }
      else {
        if (cVar1 != 'A') goto LAB_001013a5;
        nsh->current_history_entry = nsh->current_history_entry + 1;
        uVar3 = nsh_history_entry_count(hist);
        uVar12 = nsh->current_history_entry;
        if (uVar3 <= uVar12) goto LAB_00101447;
      }
      nVar4 = nsh_history_get_entry(hist,uVar12,(char *)nsh);
      if (nVar4 == NSH_STATUS_OK) {
        nsh_io_erase_line();
        nsh_io_print_prompt();
        nsh_io_put_string((char *)nsh);
        sVar6 = strlen((char *)nsh);
        (nsh->line).size = (uint)sVar6;
      }
      goto LAB_001013a5;
    }
switchD_001013bc_caseD_b:
    nsh_io_put_char(cVar1);
    nsh_line_buffer_append_char(&nsh->line,cVar1);
    _Var2 = nsh_line_buffer_is_full(&nsh->line);
  } while (!_Var2);
  nsh_io_put_newline();
  pcVar13 = "WARNING: line buffer reach its maximum capacity\r\n";
  goto LAB_00101694;
LAB_001015b0:
  lVar14 = lVar15 + 1;
  uVar3 = (uint)uVar16;
  if (lVar14 - (sVar6 & 0xffffffff) != 1) {
    pcVar13 = (nsh->line).buffer + lVar15;
    lVar15 = lVar14;
    if (*pcVar13 == ' ') {
      uVar10 = ((uint)lVar14 - uVar12) - 1;
      if (0xf < uVar10) goto LAB_00101380;
      memcpy(args + uVar16,(nsh->line).buffer + uVar12,(ulong)uVar10);
      args[uVar16][uVar10] = '\0';
      uVar16 = (ulong)(uVar3 + 1);
      if (0x1f < uVar3 + 1) goto LAB_00101380;
      lVar17 = lVar17 + 1;
      uVar12 = (uint)lVar14;
    }
    goto LAB_001015b0;
  }
  uVar10 = (int)sVar6 - uVar12;
  if (0xf < uVar10) goto LAB_00101380;
  memcpy(args + uVar16,(nsh->line).buffer + uVar12,(ulong)uVar10);
  args[uVar16][uVar10] = '\0';
  if (0x1e < uVar3) goto LAB_00101380;
  ppcVar8 = argv;
  pacVar11 = args;
  while (bVar18 = lVar17 != 0, lVar17 = lVar17 + -1, bVar18) {
    *ppcVar8 = *pacVar11;
    pacVar11 = pacVar11 + 1;
    ppcVar8 = ppcVar8 + 1;
  }
  if ((argv[0] == (char *)0x0) || (*argv[0] == '\0')) goto LAB_00101380;
  pnVar9 = nsh_cmd_array_find(&nsh->cmds,argv[0]);
  if (pnVar9 != (nsh_cmd_t *)0x0) {
    if (pnVar9->handler == (nsh_cmd_handler_t *)0x0) goto LAB_00101380;
    nVar4 = (*pnVar9->handler)(uVar3 + 1,argv);
    nsh_io_printf("command \'%s\' return %d\r\n",argv[0],(ulong)nVar4);
    if (nVar4 != NSH_STATUS_CMD_NOT_FOUND) {
      if (nVar4 == NSH_STATUS_QUIT) {
        return;
      }
      goto LAB_00101380;
    }
  }
  nsh_io_put_string("ERROR: command \'");
  nsh_io_put_string(argv[0]);
  pcVar13 = "\' not found\r\n";
LAB_00101694:
  nsh_io_put_string(pcVar13);
  goto LAB_00101380;
}

Assistant:

void nsh_run(nsh_t* nsh)
{
    // Local storage for command line after spliting
    char args[NSH_CMD_ARGS_MAX_COUNT][NSH_MAX_STRING_SIZE];

    /*
     * Array of pointers that points to the string contained by 'args'.
     *
     * In C/C++, an array decays to a pointer in most circumstances,
     * but this isn't recursive. So a T[] decays to a T*, but a T[][]
     * doesn't decay to a T**. Therefore we are forced to add an extra
     * step: char[][] -> char*[] -> char**
     */
    char* argv[NSH_CMD_ARGS_MAX_COUNT] = { NULL };

    while (true) {
        unsigned int argc = 0;

        nsh_io_print_prompt();

        // Read a command line and store it into 'nsh->line.buffer'
        nsh_status_t status = nsh_read_line(nsh);

        if (status == NSH_STATUS_OK) {
            // Split the command line into argument tokens
            if (nsh_split_command_line(nsh->line.buffer, ' ', args, &argc) != NSH_STATUS_OK) {
                // Ignore this command since there was an error
                // TODO just print a warning to the user
                continue;
            }

            // Copy the address of all tokens into 'argv'
            for (unsigned int i = 0; i < argc; i++) {
                argv[i] = args[i];
            }

            // Execute the command with 'argc' number of argument stored in 'argv'
            nsh_status_t cmd_status = nsh_execute(nsh, argc, argv);
            if (cmd_status == NSH_STATUS_CMD_NOT_FOUND) {
                nsh_io_put_string("ERROR: command '");
                nsh_io_put_string(argv[0]);
                nsh_io_put_string("' not found\r\n");
            } else if (cmd_status == NSH_STATUS_QUIT) {
                break;
            }
        }
    }
}